

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

QRegularExpressionMatch __thiscall
QRegularExpression::matchView
          (QRegularExpression *this,QStringView subjectView,qsizetype offset,MatchType matchType,
          MatchOptions matchOptions)

{
  QRegularExpressionMatchPrivate *this_00;
  QRegularExpression *re;
  undefined4 in_register_00000084;
  long in_FS_OFFSET;
  QStringView subject;
  MatchOptions in_stack_00000008;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  re = (QRegularExpression *)subjectView.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QRegularExpressionPrivate::compilePattern((re->d).d.ptr);
  this_00 = (QRegularExpressionMatchPrivate *)operator_new(0x60);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  subject.m_data = (storage_type_conflict *)offset;
  subject.m_size = (qsizetype)subjectView.m_data;
  QRegularExpressionMatchPrivate::QRegularExpressionMatchPrivate
            (this_00,re,(QString *)&local_58,subject,
             (MatchType)
             matchOptions.super_QFlagsStorageHelper<QRegularExpression::MatchOption,_4>.
             super_QFlagsStorage<QRegularExpression::MatchOption>.i,in_stack_00000008);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  QRegularExpressionPrivate::doMatch
            ((re->d).d.ptr,this_00,CONCAT44(in_register_00000084,matchType),CheckSubjectString,
             (QRegularExpressionMatchPrivate *)0x0);
  QRegularExpressionMatch::QRegularExpressionMatch((QRegularExpressionMatch *)this,this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegularExpressionMatch QRegularExpression::matchView(QStringView subjectView,
                                                      qsizetype offset,
                                                      MatchType matchType,
                                                      MatchOptions matchOptions) const
{
    d.data()->compilePattern();
    auto priv = new QRegularExpressionMatchPrivate(*this,
                                                   QString(),
                                                   subjectView,
                                                   matchType,
                                                   matchOptions);
    d->doMatch(priv, offset);
    return QRegularExpressionMatch(*priv);
}